

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O2

cell * references::scheme::proc_head(cell *__return_storage_ptr__,cells *c)

{
  cell::cell(__return_storage_ptr__,
             (((c->
               super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
               )._M_impl.super__Vector_impl_data._M_start)->list).
             super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>
             ._M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

cell proc_head(const cells & c) { return c[0].list[0]; }